

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestValueTestnonIntegers::runTestCase(TestValueTestnonIntegers *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  ValueType VVar10;
  char *pcVar11;
  long in_RDI;
  float fVar12;
  float fVar13;
  Value *this_00;
  char *pcVar14;
  string *actual;
  Value *in_stack_00000028;
  Value *in_stack_000001c8;
  PredicateContext _minitest_Context_4;
  PredicateContext _minitest_Context_3;
  PredicateContext _minitest_Context_2;
  PredicateContext _minitest_Context_1;
  PredicateContext _minitest_Context;
  Value val;
  IsCheck checks;
  Value *in_stack_fffffffffffff7a8;
  Value *in_stack_fffffffffffff7b0;
  allocator *paVar15;
  char *in_stack_fffffffffffff7b8;
  TestResult *in_stack_fffffffffffff7c0;
  string *in_stack_fffffffffffff7c8;
  string *expected;
  TestResult *in_stack_fffffffffffff7d0;
  TestResult *result;
  undefined4 in_stack_fffffffffffff7e0;
  undefined4 in_stack_fffffffffffff7e4;
  ValueType in_stack_fffffffffffff804;
  Value *in_stack_fffffffffffff808;
  char *in_stack_fffffffffffff848;
  undefined8 in_stack_fffffffffffff850;
  uint uVar16;
  undefined4 in_stack_fffffffffffff858;
  undefined4 in_stack_fffffffffffff85c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual_00;
  char *in_stack_fffffffffffff868;
  undefined1 in_stack_fffffffffffff870;
  undefined1 in_stack_fffffffffffff871;
  undefined1 in_stack_fffffffffffff872;
  undefined1 in_stack_fffffffffffff873;
  undefined1 in_stack_fffffffffffff874;
  undefined1 in_stack_fffffffffffff875;
  undefined1 in_stack_fffffffffffff876;
  undefined1 in_stack_fffffffffffff877;
  Value *in_stack_fffffffffffff878;
  Value *value;
  undefined4 in_stack_fffffffffffff880;
  undefined4 in_stack_fffffffffffff884;
  Value *in_stack_fffffffffffff968;
  Value *this_01;
  Value *in_stack_fffffffffffff9b8;
  Value *in_stack_fffffffffffff9c8;
  Value *this_02;
  string local_590 [32];
  string local_570 [39];
  allocator local_549;
  string local_548 [72];
  string local_500 [32];
  string local_4e0 [39];
  undefined1 local_4b9 [73];
  string local_470 [32];
  string local_450 [39];
  allocator local_429;
  string local_428 [72];
  string local_3e0 [32];
  string local_3c0 [39];
  allocator local_399;
  string local_398 [72];
  string local_350 [32];
  string local_330 [32];
  undefined4 local_310 [2];
  char *local_308;
  undefined4 local_300;
  char *local_2f8;
  undefined8 local_2f0;
  undefined8 local_2e8;
  IsCheck local_2dc [4];
  string local_2a8 [32];
  string local_288 [32];
  undefined4 local_268 [2];
  char *local_260;
  undefined4 local_258;
  char *local_250;
  undefined8 local_248;
  undefined8 local_240;
  IsCheck local_234 [4];
  string local_200 [32];
  string local_1e0 [32];
  undefined4 local_1c0 [2];
  char *local_1b8;
  undefined4 local_1b0;
  char *local_1a8;
  undefined8 local_1a0;
  undefined8 local_198;
  IsCheck local_18c [4];
  string local_158 [32];
  undefined4 local_138 [2];
  char *local_130;
  undefined4 local_128;
  char *local_120;
  undefined8 local_118;
  undefined8 local_110;
  IsCheck local_104 [4];
  string local_d0 [32];
  undefined4 local_b0 [2];
  char *local_a8;
  undefined4 local_a0;
  char *local_98;
  undefined8 local_90;
  undefined8 local_88;
  IsCheck local_80 [5];
  Value local_40;
  IsCheck local_18 [2];
  
  uVar16 = (uint)((ulong)in_stack_fffffffffffff850 >> 0x20);
  ValueTest::IsCheck::IsCheck(local_18);
  Json::Value::Value((Value *)in_stack_fffffffffffff7c0,
                     (ValueType)((ulong)in_stack_fffffffffffff7b8 >> 0x20));
  Json::Value::Value(in_stack_fffffffffffff7b0,(double)in_stack_fffffffffffff7a8);
  Json::Value::operator=(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
  Json::Value::type(&local_40);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (in_stack_fffffffffffff7d0,(ValueType)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             (ValueType)in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0,
             (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(char *)in_stack_fffffffffffff7b0);
  ValueTest::IsCheck::IsCheck(local_80);
  local_18[0].isObject_ = local_80[0].isObject_;
  local_18[0].isArray_ = local_80[0].isArray_;
  local_18[0].isBool_ = local_80[0].isBool_;
  local_18[0].isString_ = local_80[0].isString_;
  local_18[0].isNull_ = local_80[0].isNull_;
  local_18[0].isInt_ = local_80[0].isInt_;
  local_18[0].isInt64_ = local_80[0].isInt64_;
  local_18[0].isUInt_ = local_80[0].isUInt_;
  local_18[0].isDouble_ = true;
  local_18[0].isUInt64_ = local_80[0].isUInt64_;
  local_18[0].isIntegral_ = local_80[0].isIntegral_;
  local_18[0].isNumeric_ = true;
  local_b0[0] = **(undefined4 **)(in_RDI + 8);
  local_a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_a0 = 0x482;
  local_98 = "checkIs(val, checks)";
  local_90 = 0;
  local_88 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_b0;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_b0;
  ValueTest::checkIs((ValueTest *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                     in_stack_fffffffffffff878,
                     (IsCheck *)
                     CONCAT17(in_stack_fffffffffffff877,
                              CONCAT16(in_stack_fffffffffffff876,
                                       CONCAT15(in_stack_fffffffffffff875,
                                                CONCAT14(in_stack_fffffffffffff874,
                                                         CONCAT13(in_stack_fffffffffffff873,
                                                                  CONCAT12(in_stack_fffffffffffff872
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff871,
                                                  in_stack_fffffffffffff870))))))));
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  Json::Value::asDouble(in_stack_fffffffffffff9b8);
  JsonTest::checkEqual<double,double>
            (in_stack_fffffffffffff7d0,(double)in_stack_fffffffffffff7c8,
             (double)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  Json::Value::asFloat(in_stack_fffffffffffff9b8);
  JsonTest::checkEqual<double,float>
            (in_stack_fffffffffffff7d0,(double)in_stack_fffffffffffff7c8,
             (float)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  Json::Value::asInt(in_stack_00000028);
  JsonTest::checkEqual<int,int>
            (in_stack_fffffffffffff7d0,(int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             (int)in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0,
             (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(char *)in_stack_fffffffffffff7b0);
  Json::Value::asLargestInt((Value *)0x1541b6);
  JsonTest::checkEqual<int,long_long>
            (in_stack_fffffffffffff7d0,(int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             (longlong)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  Json::Value::asUInt(in_stack_000001c8);
  JsonTest::checkEqual<int,unsigned_int>
            (in_stack_fffffffffffff7d0,(int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             (uint)in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0,
             (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(char *)in_stack_fffffffffffff7b0);
  Json::Value::asLargestUInt((Value *)0x15426a);
  JsonTest::checkEqual<int,unsigned_long_long>
            (in_stack_fffffffffffff7d0,(int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             (unsigned_long_long)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  Json::Value::asBool(in_stack_fffffffffffff968);
  JsonTest::checkEqual<bool,bool>
            (in_stack_fffffffffffff7c0,SUB81((ulong)in_stack_fffffffffffff7b8 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffff7b8 >> 0x30,0),(char *)in_stack_fffffffffffff7b0,
             (uint)((ulong)in_stack_fffffffffffff7a8 >> 0x20),(char *)0x154301);
  Json::Value::asString_abi_cxx11_(in_stack_fffffffffffff9c8);
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            ((TestResult *)
             CONCAT17(in_stack_fffffffffffff877,
                      CONCAT16(in_stack_fffffffffffff876,
                               CONCAT15(in_stack_fffffffffffff875,
                                        CONCAT14(in_stack_fffffffffffff874,
                                                 CONCAT13(in_stack_fffffffffffff873,
                                                          CONCAT12(in_stack_fffffffffffff872,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff871,
                                                  in_stack_fffffffffffff870))))))),
             in_stack_fffffffffffff868,in_stack_fffffffffffff860,
             (char *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),uVar16,
             in_stack_fffffffffffff848);
  std::__cxx11::string::~string(local_d0);
  Json::Value::Value(in_stack_fffffffffffff7b0,(double)in_stack_fffffffffffff7a8);
  Json::Value::operator=(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
  this_02 = *(Value **)(in_RDI + 8);
  Json::Value::type(&local_40);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (in_stack_fffffffffffff7d0,(ValueType)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             (ValueType)in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0,
             (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(char *)in_stack_fffffffffffff7b0);
  ValueTest::IsCheck::IsCheck(local_104);
  local_18[0].isObject_ = local_104[0].isObject_;
  local_18[0].isArray_ = local_104[0].isArray_;
  local_18[0].isBool_ = local_104[0].isBool_;
  local_18[0].isString_ = local_104[0].isString_;
  local_18[0].isNull_ = local_104[0].isNull_;
  local_18[0].isInt_ = local_104[0].isInt_;
  local_18[0].isInt64_ = local_104[0].isInt64_;
  local_18[0].isUInt_ = local_104[0].isUInt_;
  local_18[0].isDouble_ = true;
  local_18[0].isUInt64_ = local_104[0].isUInt64_;
  local_18[0].isIntegral_ = local_104[0].isIntegral_;
  local_18[0].isNumeric_ = true;
  local_138[0] = **(undefined4 **)(in_RDI + 8);
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_128 = 0x49e;
  local_120 = "checkIs(val, checks)";
  local_118 = 0;
  local_110 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_138;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_138;
  ValueTest::checkIs((ValueTest *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                     in_stack_fffffffffffff878,
                     (IsCheck *)
                     CONCAT17(in_stack_fffffffffffff877,
                              CONCAT16(in_stack_fffffffffffff876,
                                       CONCAT15(in_stack_fffffffffffff875,
                                                CONCAT14(in_stack_fffffffffffff874,
                                                         CONCAT13(in_stack_fffffffffffff873,
                                                                  CONCAT12(in_stack_fffffffffffff872
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff871,
                                                  in_stack_fffffffffffff870))))))));
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  this_00 = (Value *)Json::Value::asDouble(in_stack_fffffffffffff9b8);
  JsonTest::checkEqual<double,double>
            (in_stack_fffffffffffff7d0,(double)in_stack_fffffffffffff7c8,
             (double)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  Json::Value::asFloat(this_00);
  JsonTest::checkEqual<double,float>
            (in_stack_fffffffffffff7d0,(double)in_stack_fffffffffffff7c8,
             (float)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  Json::Value::asInt(in_stack_00000028);
  JsonTest::checkEqual<int,int>
            (in_stack_fffffffffffff7d0,(int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             (int)in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0,
             (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(char *)in_stack_fffffffffffff7b0);
  Json::Value::asLargestInt((Value *)0x1548f5);
  JsonTest::checkEqual<int,long_long>
            (in_stack_fffffffffffff7d0,(int)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             (longlong)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  Json::Value::asBool(in_stack_fffffffffffff968);
  JsonTest::checkEqual<bool,bool>
            (in_stack_fffffffffffff7c0,SUB81((ulong)in_stack_fffffffffffff7b8 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffff7b8 >> 0x30,0),(char *)in_stack_fffffffffffff7b0,
             (uint)((ulong)in_stack_fffffffffffff7a8 >> 0x20),(char *)0x15498c);
  this_01 = *(Value **)(in_RDI + 8);
  Json::Value::asString_abi_cxx11_(this_02);
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            ((TestResult *)
             CONCAT17(in_stack_fffffffffffff877,
                      CONCAT16(in_stack_fffffffffffff876,
                               CONCAT15(in_stack_fffffffffffff875,
                                        CONCAT14(in_stack_fffffffffffff874,
                                                 CONCAT13(in_stack_fffffffffffff873,
                                                          CONCAT12(in_stack_fffffffffffff872,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff871,
                                                  in_stack_fffffffffffff870))))))),
             in_stack_fffffffffffff868,in_stack_fffffffffffff860,
             (char *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),uVar16,
             in_stack_fffffffffffff848);
  std::__cxx11::string::~string(local_158);
  Json::Value::Value(in_stack_fffffffffffff7b0,(double)in_stack_fffffffffffff7a8);
  Json::Value::operator=(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
  Json::Value::type(&local_40);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (in_stack_fffffffffffff7d0,(ValueType)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             (ValueType)in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0,
             (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(char *)in_stack_fffffffffffff7b0);
  ValueTest::IsCheck::IsCheck(local_18c);
  local_18[0].isObject_ = local_18c[0].isObject_;
  local_18[0].isArray_ = local_18c[0].isArray_;
  local_18[0].isBool_ = local_18c[0].isBool_;
  local_18[0].isString_ = local_18c[0].isString_;
  local_18[0].isNull_ = local_18c[0].isNull_;
  local_18[0].isInt_ = local_18c[0].isInt_;
  local_18[0].isInt64_ = local_18c[0].isInt64_;
  local_18[0].isUInt_ = local_18c[0].isUInt_;
  local_18[0].isDouble_ = true;
  local_18[0].isUInt64_ = local_18c[0].isUInt64_;
  local_18[0].isIntegral_ = local_18c[0].isIntegral_;
  local_18[0].isNumeric_ = true;
  local_1c0[0] = **(undefined4 **)(in_RDI + 8);
  local_1b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_1b0 = 0x4b8;
  local_1a8 = "checkIs(val, checks)";
  local_1a0 = 0;
  local_198 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_1c0;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_1c0;
  ValueTest::checkIs((ValueTest *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                     in_stack_fffffffffffff878,
                     (IsCheck *)
                     CONCAT17(in_stack_fffffffffffff877,
                              CONCAT16(in_stack_fffffffffffff876,
                                       CONCAT15(in_stack_fffffffffffff875,
                                                CONCAT14(in_stack_fffffffffffff874,
                                                         CONCAT13(in_stack_fffffffffffff873,
                                                                  CONCAT12(in_stack_fffffffffffff872
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff871,
                                                  in_stack_fffffffffffff870))))))));
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  Json::Value::asDouble(this_00);
  JsonTest::checkEqual<double,double>
            (in_stack_fffffffffffff7d0,(double)in_stack_fffffffffffff7c8,
             (double)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  Json::Value::asFloat(this_00);
  JsonTest::checkEqual<float,float>
            (in_stack_fffffffffffff7d0,(float)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             SUB84(in_stack_fffffffffffff7c8,0),(char *)in_stack_fffffffffffff7c0,
             (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(char *)in_stack_fffffffffffff7b0);
  Json::Value::asUInt(in_stack_000001c8);
  JsonTest::checkEqual<unsigned_int,unsigned_int>
            (in_stack_fffffffffffff7d0,(uint)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             (uint)in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0,
             (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(char *)in_stack_fffffffffffff7b0);
  Json::Value::asLargestInt((Value *)0x154f8f);
  JsonTest::checkEqual<long,long_long>
            (in_stack_fffffffffffff7d0,(long)in_stack_fffffffffffff7c8,
             (longlong)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  Json::Value::asLargestUInt((Value *)0x154fea);
  JsonTest::checkEqual<unsigned_int,unsigned_long_long>
            (in_stack_fffffffffffff7d0,(uint)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             (unsigned_long_long)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  Json::Value::asBool(this_01);
  JsonTest::checkEqual<bool,bool>
            (in_stack_fffffffffffff7c0,SUB81((ulong)in_stack_fffffffffffff7b8 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffff7b8 >> 0x30,0),(char *)in_stack_fffffffffffff7b0,
             (uint)((ulong)in_stack_fffffffffffff7a8 >> 0x20),(char *)0x155081);
  Json::Value::asString_abi_cxx11_(this_02);
  ValueTest::normalizeFloatingPointStr
            ((string *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            ((TestResult *)
             CONCAT17(in_stack_fffffffffffff877,
                      CONCAT16(in_stack_fffffffffffff876,
                               CONCAT15(in_stack_fffffffffffff875,
                                        CONCAT14(in_stack_fffffffffffff874,
                                                 CONCAT13(in_stack_fffffffffffff873,
                                                          CONCAT12(in_stack_fffffffffffff872,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff871,
                                                  in_stack_fffffffffffff870))))))),
             in_stack_fffffffffffff868,in_stack_fffffffffffff860,
             (char *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),uVar16,
             in_stack_fffffffffffff848);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_200);
  Json::Value::Value(in_stack_fffffffffffff7b0,(double)in_stack_fffffffffffff7a8);
  Json::Value::operator=(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
  Json::Value::type(&local_40);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (in_stack_fffffffffffff7d0,(ValueType)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             (ValueType)in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0,
             (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(char *)in_stack_fffffffffffff7b0);
  ValueTest::IsCheck::IsCheck(local_234);
  local_18[0].isObject_ = local_234[0].isObject_;
  local_18[0].isArray_ = local_234[0].isArray_;
  local_18[0].isBool_ = local_234[0].isBool_;
  local_18[0].isString_ = local_234[0].isString_;
  local_18[0].isNull_ = local_234[0].isNull_;
  local_18[0].isInt_ = local_234[0].isInt_;
  local_18[0].isInt64_ = local_234[0].isInt64_;
  local_18[0].isUInt_ = local_234[0].isUInt_;
  local_18[0].isDouble_ = true;
  local_18[0].isUInt64_ = local_234[0].isUInt64_;
  local_18[0].isIntegral_ = local_234[0].isIntegral_;
  local_18[0].isNumeric_ = true;
  local_268[0] = **(undefined4 **)(in_RDI + 8);
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_258 = 0x4d6;
  local_250 = "checkIs(val, checks)";
  local_248 = 0;
  local_240 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_268;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_268;
  ValueTest::checkIs((ValueTest *)CONCAT44(in_stack_fffffffffffff884,in_stack_fffffffffffff880),
                     in_stack_fffffffffffff878,
                     (IsCheck *)
                     CONCAT17(in_stack_fffffffffffff877,
                              CONCAT16(in_stack_fffffffffffff876,
                                       CONCAT15(in_stack_fffffffffffff875,
                                                CONCAT14(in_stack_fffffffffffff874,
                                                         CONCAT13(in_stack_fffffffffffff873,
                                                                  CONCAT12(in_stack_fffffffffffff872
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff871,
                                                  in_stack_fffffffffffff870))))))));
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  bVar1 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (bVar1) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  Json::Value::asDouble(this_00);
  JsonTest::checkEqual<double,double>
            (in_stack_fffffffffffff7d0,(double)in_stack_fffffffffffff7c8,
             (double)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  Json::Value::asFloat(this_00);
  JsonTest::checkEqual<float,float>
            (in_stack_fffffffffffff7d0,(float)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             SUB84(in_stack_fffffffffffff7c8,0),(char *)in_stack_fffffffffffff7c0,
             (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(char *)in_stack_fffffffffffff7b0);
  Json::Value::asLargestInt((Value *)0x155675);
  JsonTest::checkEqual<long_long,long_long>
            (in_stack_fffffffffffff7d0,(longlong)in_stack_fffffffffffff7c8,
             (longlong)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  Json::Value::asBool(this_01);
  JsonTest::checkEqual<bool,bool>
            (in_stack_fffffffffffff7c0,SUB81((ulong)in_stack_fffffffffffff7b8 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffff7b8 >> 0x30,0),(char *)in_stack_fffffffffffff7b0,
             (uint)((ulong)in_stack_fffffffffffff7a8 >> 0x20),(char *)0x15570e);
  Json::Value::asString_abi_cxx11_(this_02);
  ValueTest::normalizeFloatingPointStr
            ((string *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            ((TestResult *)
             CONCAT17(in_stack_fffffffffffff877,
                      CONCAT16(in_stack_fffffffffffff876,
                               CONCAT15(in_stack_fffffffffffff875,
                                        CONCAT14(in_stack_fffffffffffff874,
                                                 CONCAT13(in_stack_fffffffffffff873,
                                                          CONCAT12(in_stack_fffffffffffff872,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff871,
                                                  in_stack_fffffffffffff870))))))),
             in_stack_fffffffffffff868,in_stack_fffffffffffff860,
             (char *)CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858),uVar16,
             in_stack_fffffffffffff848);
  std::__cxx11::string::~string(local_288);
  std::__cxx11::string::~string(local_2a8);
  Json::Value::Value(in_stack_fffffffffffff7b0,(double)in_stack_fffffffffffff7a8);
  Json::Value::operator=(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
  value = *(Value **)(in_RDI + 8);
  VVar10 = Json::Value::type(&local_40);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (in_stack_fffffffffffff7d0,(ValueType)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             (ValueType)in_stack_fffffffffffff7c8,(char *)in_stack_fffffffffffff7c0,
             (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(char *)in_stack_fffffffffffff7b0);
  ValueTest::IsCheck::IsCheck(local_2dc);
  local_18[0].isObject_ = local_2dc[0].isObject_;
  local_18[0].isArray_ = local_2dc[0].isArray_;
  local_18[0].isBool_ = local_2dc[0].isBool_;
  local_18[0].isString_ = local_2dc[0].isString_;
  local_18[0].isNull_ = local_2dc[0].isNull_;
  local_18[0].isInt_ = local_2dc[0].isInt_;
  local_18[0].isInt64_ = local_2dc[0].isInt64_;
  local_18[0].isUInt_ = local_2dc[0].isUInt_;
  local_18[0].isDouble_ = true;
  local_18[0].isUInt64_ = local_2dc[0].isUInt64_;
  local_18[0].isIntegral_ = local_2dc[0].isIntegral_;
  local_18[0].isNumeric_ = true;
  local_310[0] = **(undefined4 **)(in_RDI + 8);
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kurento[P]jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_300 = 0x4f2;
  local_2f8 = "checkIs(val, checks)";
  local_2f0 = 0;
  local_2e8 = 0;
  *(undefined4 **)(*(long *)(*(long *)(in_RDI + 8) + 8) + 0x20) = local_310;
  **(int **)(in_RDI + 8) = **(int **)(in_RDI + 8) + 1;
  *(undefined4 **)(*(long *)(in_RDI + 8) + 8) = local_310;
  ValueTest::checkIs((ValueTest *)CONCAT44(VVar10,in_stack_fffffffffffff880),value,
                     (IsCheck *)
                     CONCAT17(in_stack_fffffffffffff877,
                              CONCAT16(in_stack_fffffffffffff876,
                                       CONCAT15(in_stack_fffffffffffff875,
                                                CONCAT14(in_stack_fffffffffffff874,
                                                         CONCAT13(in_stack_fffffffffffff873,
                                                                  CONCAT12(in_stack_fffffffffffff872
                                                                           ,CONCAT11(
                                                  in_stack_fffffffffffff871,
                                                  in_stack_fffffffffffff870))))))));
  JsonTest::TestResult::popPredicateContext(*(TestResult **)(in_RDI + 8));
  uVar2 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!(bool)uVar2) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  uVar3 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!(bool)uVar3) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  uVar4 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if (!(bool)uVar4) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  uVar5 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if ((bool)uVar5) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  uVar6 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if ((bool)uVar6) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  uVar7 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if ((bool)uVar7) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  uVar8 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if ((bool)uVar8) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  uVar9 = Json::Value::isConvertibleTo(in_stack_fffffffffffff808,in_stack_fffffffffffff804);
  if ((bool)uVar9) {
    JsonTest::TestResult::addFailure
              (in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8,
               (uint)((ulong)in_stack_fffffffffffff7c0 >> 0x20),in_stack_fffffffffffff7b8);
  }
  actual_00 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(in_RDI + 8);
  pcVar14 = (char *)Json::Value::asDouble(this_00);
  JsonTest::checkEqual<double,double>
            (in_stack_fffffffffffff7d0,(double)in_stack_fffffffffffff7c8,
             (double)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  uVar16 = (uint)((ulong)*(undefined8 *)(in_RDI + 8) >> 0x20);
  fVar12 = Json::Value::asFloat(this_00);
  JsonTest::checkEqual<float,float>
            (in_stack_fffffffffffff7d0,(float)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             SUB84(in_stack_fffffffffffff7c8,0),(char *)in_stack_fffffffffffff7c0,
             (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(char *)in_stack_fffffffffffff7b0);
  pcVar11 = (char *)Json::Value::asLargestInt((Value *)0x155d05);
  JsonTest::checkEqual<long_long,long_long>
            (in_stack_fffffffffffff7d0,(longlong)in_stack_fffffffffffff7c8,
             (longlong)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  Json::Value::asLargestUInt((Value *)0x155d60);
  JsonTest::checkEqual<unsigned_long_long,unsigned_long_long>
            (in_stack_fffffffffffff7d0,(unsigned_long_long)in_stack_fffffffffffff7c8,
             (unsigned_long_long)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  Json::Value::asBool(this_01);
  JsonTest::checkEqual<bool,bool>
            (in_stack_fffffffffffff7c0,SUB81((ulong)in_stack_fffffffffffff7b8 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffff7b8 >> 0x30,0),(char *)in_stack_fffffffffffff7b0,
             (uint)((ulong)in_stack_fffffffffffff7a8 >> 0x20),(char *)0x155df1);
  Json::Value::asString_abi_cxx11_(this_02);
  ValueTest::normalizeFloatingPointStr((string *)CONCAT44(fVar12,in_stack_fffffffffffff858));
  JsonTest::checkEqual<char_const*,std::__cxx11::string>
            ((TestResult *)
             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))),pcVar14,
             actual_00,(char *)CONCAT44(fVar12,in_stack_fffffffffffff858),uVar16,pcVar11);
  std::__cxx11::string::~string(local_330);
  std::__cxx11::string::~string(local_350);
  Json::Value::Value(in_stack_fffffffffffff7b0,(double)in_stack_fffffffffffff7a8);
  Json::Value::operator=(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"1.2345678901234001",&local_399);
  Json::Value::asString_abi_cxx11_(this_02);
  ValueTest::normalizeFloatingPointStr((string *)CONCAT44(fVar12,in_stack_fffffffffffff858));
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,(string *)in_stack_fffffffffffff7c0
             ,in_stack_fffffffffffff7b8,(uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),
             (char *)in_stack_fffffffffffff7a8);
  std::__cxx11::string::~string(local_3c0);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  Json::Value::Value(in_stack_fffffffffffff7b0,(double)in_stack_fffffffffffff7a8);
  Json::Value::operator=(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
  Json::Value::asFloat(this_00);
  JsonTest::checkEqual<float,float>
            (in_stack_fffffffffffff7d0,(float)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             SUB84(in_stack_fffffffffffff7c8,0),(char *)in_stack_fffffffffffff7c0,
             (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(char *)in_stack_fffffffffffff7b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_428,"2199023255552000",&local_429);
  Json::Value::asString_abi_cxx11_(this_02);
  ValueTest::normalizeFloatingPointStr((string *)CONCAT44(fVar12,in_stack_fffffffffffff858));
  JsonTest::checkStringEqual
            (in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,(string *)in_stack_fffffffffffff7c0
             ,in_stack_fffffffffffff7b8,(uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),
             (char *)in_stack_fffffffffffff7a8);
  std::__cxx11::string::~string(local_450);
  std::__cxx11::string::~string(local_470);
  std::__cxx11::string::~string(local_428);
  std::allocator<char>::~allocator((allocator<char> *)&local_429);
  Json::Value::Value(in_stack_fffffffffffff7b0,(double)in_stack_fffffffffffff7a8);
  Json::Value::operator=(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  Json::Value::~Value((Value *)CONCAT44(in_stack_fffffffffffff7e4,in_stack_fffffffffffff7e0));
  fVar13 = Json::Value::asFloat(this_00);
  JsonTest::checkEqual<float,float>
            (in_stack_fffffffffffff7d0,(float)((ulong)in_stack_fffffffffffff7c8 >> 0x20),
             SUB84(in_stack_fffffffffffff7c8,0),(char *)in_stack_fffffffffffff7c0,
             (uint)((ulong)in_stack_fffffffffffff7b8 >> 0x20),(char *)in_stack_fffffffffffff7b0);
  expected = *(string **)(in_RDI + 8);
  result = (TestResult *)local_4b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_4b9 + 1),"3.402823466385289e+38",(allocator *)result);
  Json::Value::asString_abi_cxx11_(this_02);
  ValueTest::normalizeFloatingPointStr((string *)CONCAT44(fVar12,in_stack_fffffffffffff858));
  JsonTest::checkStringEqual
            (result,expected,(string *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8,
             (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20),(char *)in_stack_fffffffffffff7a8);
  std::__cxx11::string::~string(local_4e0);
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::~string((string *)(local_4b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4b9);
  Json::Value::Value(in_stack_fffffffffffff7b0,(double)in_stack_fffffffffffff7a8);
  Json::Value::operator=(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
  uVar16 = (uint)((ulong)in_stack_fffffffffffff7b0 >> 0x20);
  Json::Value::~Value((Value *)CONCAT44(fVar13,in_stack_fffffffffffff7e0));
  pcVar11 = *(char **)(in_RDI + 8);
  actual = (string *)Json::Value::asDouble(this_00);
  JsonTest::checkEqual<double,double>
            (result,(double)expected,(double)actual,pcVar11,uVar16,(char *)in_stack_fffffffffffff7a8
            );
  pcVar14 = *(char **)(in_RDI + 8);
  paVar15 = &local_549;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_548,"1.2345678e+300",paVar15);
  uVar16 = (uint)((ulong)paVar15 >> 0x20);
  Json::Value::asString_abi_cxx11_(this_02);
  ValueTest::normalizeFloatingPointStr((string *)CONCAT44(fVar12,in_stack_fffffffffffff858));
  JsonTest::checkStringEqual(result,expected,actual,pcVar11,uVar16,pcVar14);
  std::__cxx11::string::~string(local_570);
  std::__cxx11::string::~string(local_590);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  Json::Value::~Value((Value *)CONCAT44(fVar13,in_stack_fffffffffffff7e0));
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, nonIntegers) {
  IsCheck checks;
  Json::Value val;

  // Small positive number
  val = Json::Value(1.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(1.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(1.5, val.asFloat());
  JSONTEST_ASSERT_EQUAL(1, val.asInt());
  JSONTEST_ASSERT_EQUAL(1, val.asLargestInt());
  JSONTEST_ASSERT_EQUAL(1, val.asUInt());
  JSONTEST_ASSERT_EQUAL(1, val.asLargestUInt());
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("1.5", val.asString());

  // Small negative number
  val = Json::Value(-1.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(-1.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(-1.5, val.asFloat());
  JSONTEST_ASSERT_EQUAL(-1, val.asInt());
  JSONTEST_ASSERT_EQUAL(-1, val.asLargestInt());
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("-1.5", val.asString());

  // A bit over int32 max
  val = Json::Value(kint32max + 0.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(2147483647.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(float(2147483647.5), val.asFloat());
  JSONTEST_ASSERT_EQUAL(2147483647U, val.asUInt());
#ifdef JSON_HAS_INT64
  JSONTEST_ASSERT_EQUAL(2147483647L, val.asLargestInt());
  JSONTEST_ASSERT_EQUAL(2147483647U, val.asLargestUInt());
#endif
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("2147483647.5",
                        normalizeFloatingPointStr(val.asString()));

  // A bit under int32 min
  val = Json::Value(kint32min - 0.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(-2147483648.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(float(-2147483648.5), val.asFloat());
#ifdef JSON_HAS_INT64
  JSONTEST_ASSERT_EQUAL(-Json::Int64(1) << 31, val.asLargestInt());
#endif
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("-2147483648.5",
                        normalizeFloatingPointStr(val.asString()));

  // A bit over uint32 max
  val = Json::Value(kuint32max + 0.5);

  JSONTEST_ASSERT_EQUAL(Json::realValue, val.type());

  checks = IsCheck();
  checks.isDouble_ = true;
  checks.isNumeric_ = true;
  JSONTEST_ASSERT_PRED(checkIs(val, checks));

  JSONTEST_ASSERT(val.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(val.isConvertibleTo(Json::stringValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::nullValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!val.isConvertibleTo(Json::objectValue));

  JSONTEST_ASSERT_EQUAL(4294967295.5, val.asDouble());
  JSONTEST_ASSERT_EQUAL(float(4294967295.5), val.asFloat());
#ifdef JSON_HAS_INT64
  JSONTEST_ASSERT_EQUAL((Json::Int64(1) << 32) - 1, val.asLargestInt());
  JSONTEST_ASSERT_EQUAL((Json::UInt64(1) << 32) - Json::UInt64(1),
                        val.asLargestUInt());
#endif
  JSONTEST_ASSERT_EQUAL(true, val.asBool());
  JSONTEST_ASSERT_EQUAL("4294967295.5",
                        normalizeFloatingPointStr(val.asString()));

  val = Json::Value(1.2345678901234);
  JSONTEST_ASSERT_STRING_EQUAL("1.2345678901234001",
                               normalizeFloatingPointStr(val.asString()));

  // A 16-digit floating point number.
  val = Json::Value(2199023255552000.0f);
  JSONTEST_ASSERT_EQUAL(float(2199023255552000), val.asFloat());
  JSONTEST_ASSERT_STRING_EQUAL("2199023255552000",
                               normalizeFloatingPointStr(val.asString()));

  // A very large floating point number.
  val = Json::Value(3.402823466385289e38);
  JSONTEST_ASSERT_EQUAL(float(3.402823466385289e38), val.asFloat());
  JSONTEST_ASSERT_STRING_EQUAL("3.402823466385289e+38",
                               normalizeFloatingPointStr(val.asString()));

  // An even larger floating point number.
  val = Json::Value(1.2345678e300);
  JSONTEST_ASSERT_EQUAL(double(1.2345678e300), val.asDouble());
  JSONTEST_ASSERT_STRING_EQUAL("1.2345678e+300",
                               normalizeFloatingPointStr(val.asString()));
}